

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchSCHashTable.c
# Opt level: O3

Fxch_SCHashTable_t * Fxch_SCHashTableCreate(Fxch_Man_t *pFxchMan,int nEntries)

{
  int iVar1;
  Fxch_SCHashTable_t *pFVar2;
  Fxch_SCHashTable_Entry_t *pFVar3;
  uint uVar4;
  
  pFVar2 = (Fxch_SCHashTable_t *)calloc(1,0x38);
  iVar1 = 0x1f;
  if (nEntries != 0) {
    for (; (uint)nEntries >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  uVar4 = (uint)(byte)(0x20 - ((byte)iVar1 ^ 0x1f));
  if (nEntries + 1U < 2) {
    uVar4 = nEntries + 1U;
  }
  uVar4 = 1 << ((byte)uVar4 & 0x1f);
  pFVar2->pFxchMan = pFxchMan;
  pFVar2->SizeMask = uVar4 - 1;
  pFVar3 = (Fxch_SCHashTable_Entry_t *)calloc((ulong)uVar4,0x10);
  pFVar2->pBins = pFVar3;
  return pFVar2;
}

Assistant:

Fxch_SCHashTable_t* Fxch_SCHashTableCreate( Fxch_Man_t* pFxchMan,
                                            int nEntries )
{
    Fxch_SCHashTable_t* pSCHashTable = ABC_CALLOC( Fxch_SCHashTable_t, 1 );
    int nBits = Abc_Base2Log( nEntries + 1 );


    pSCHashTable->pFxchMan = pFxchMan;
    pSCHashTable->SizeMask = (1 << nBits) - 1;
    pSCHashTable->pBins = ABC_CALLOC( Fxch_SCHashTable_Entry_t, pSCHashTable->SizeMask + 1 );

    return pSCHashTable;
}